

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  nn_trie_node **self_00;
  nn_trie_node *pnVar7;
  nn_trie_node *pnVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long *plVar14;
  byte *pbVar15;
  ulong uVar16;
  bool bVar17;
  int local_34;
  
  if (size != 0) {
    pnVar8 = *self;
    bVar4 = pnVar8->prefix_len;
    uVar11 = (ulong)(uint)bVar4;
    uVar12 = (uint)bVar4;
    if (bVar4 != 0) {
      uVar11 = 0;
      do {
        if (size == uVar11) {
          uVar11 = size & 0xffffffff;
          goto LAB_00102b8d;
        }
        if (pnVar8->prefix[uVar11] != data[uVar11]) goto LAB_00102b8d;
        uVar11 = uVar11 + 1;
      } while (bVar4 != uVar11);
      uVar11 = (ulong)uVar12;
    }
LAB_00102b8d:
    if ((uint)uVar11 != uVar12) {
      return 0;
    }
    uVar11 = (ulong)uVar12;
    if (uVar11 != size) {
      pbVar15 = data + uVar11;
      self_00 = nn_node_next(pnVar8,*pbVar15);
      if (self_00 == (nn_trie_node **)0x0) {
        return 0;
      }
      iVar5 = nn_node_unsubscribe(self_00,pbVar15 + 1,~uVar11 + size);
      if (iVar5 == 0) {
        return 0;
      }
      if (*self_00 != (nn_trie_node *)0x0) {
        return 1;
      }
      pnVar8 = *self;
      bVar4 = pnVar8->type;
      if (bVar4 < 9) {
        bVar17 = bVar4 == 0;
        if (!bVar17) {
          if ((pnVar8->u).sparse.children[0] == *pbVar15) {
            uVar16 = 0;
          }
          else {
            uVar11 = 0;
            do {
              bVar17 = (ulong)(uint)bVar4 - 1 == uVar11;
              if (bVar17) goto LAB_00102f23;
              uVar16 = uVar11 + 1;
              lVar13 = uVar11 + 0xb;
              uVar11 = uVar16;
            } while (pnVar8->prefix[lVar13] != *pbVar15);
          }
          if (!bVar17) {
            uVar11 = uVar16 & 0xffffffff;
            memmove(pnVar8->prefix + uVar11 + 10,pnVar8->prefix + uVar11 + 0xb,
                    (long)(int)((uint)bVar4 + ~(uint)uVar16));
            pnVar8 = *self;
            memmove(pnVar8[1].prefix + uVar11 * 8 + -6,pnVar8[1].prefix + uVar11 * 8 + 2,
                    ((long)(int)~(uint)uVar16 + (ulong)pnVar8->type) * 8);
            pnVar8 = *self;
            bVar4 = pnVar8->type - 1;
            pnVar8->type = bVar4;
            pnVar8 = (nn_trie_node *)realloc(pnVar8,(ulong)bVar4 * 8 + 0x18);
            *self = pnVar8;
            if (pnVar8 == (nn_trie_node *)0x0) {
              __assert_fail("*self",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                            ,0x21e,
                            "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)"
                           );
            }
            if ((pnVar8->type == '\0') && (pnVar8->refcount == 0)) {
              free(pnVar8);
              *self = (nn_trie_node *)0x0;
              return 1;
            }
            pnVar8 = nn_node_compact(pnVar8);
            *self = pnVar8;
            return 1;
          }
        }
LAB_00102f23:
        __assert_fail("index != (*self)->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                      ,0x210,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      uVar3 = (pnVar8->u).dense.nbr;
      if (uVar3 < 10) {
        pnVar7 = (nn_trie_node *)malloc(0x58);
        if (pnVar7 == (nn_trie_node *)0x0) {
          __assert_fail("new_node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                        ,0x260,
                        "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
        }
        pnVar7->refcount = 0;
        bVar4 = pnVar8->prefix_len;
        pnVar7->prefix_len = bVar4;
        memcpy(pnVar7->prefix,pnVar8->prefix,(ulong)bVar4);
        pnVar7->type = '\b';
        bVar4 = (pnVar8->u).sparse.children[0];
        uVar12 = (uint)bVar4;
        if ((pnVar8->u).sparse.children[1] + 1 != (uint)bVar4) {
          uVar11 = 0;
          iVar5 = 0;
          do {
            lVar13 = *(long *)(pnVar8[1].prefix + uVar11 * 8 + -6);
            if (lVar13 != 0) {
              pnVar7->prefix[(long)iVar5 + 10] = (char)uVar12 + (char)uVar11;
              *(long *)(pnVar7[1].prefix + (long)iVar5 * 8 + -6) = lVar13;
              iVar5 = iVar5 + 1;
            }
            uVar11 = uVar11 + 1;
            uVar12 = (uint)(pnVar8->u).sparse.children[0];
          } while (uVar11 != ((pnVar8->u).sparse.children[1] - uVar12) + 1);
          if (iVar5 == 8) {
            free(pnVar8);
            *self = pnVar7;
            return 1;
          }
        }
        __assert_fail("j == NN_TRIE_SPARSE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                      ,0x26f,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      bVar4 = (pnVar8->u).sparse.children[0];
      uVar11 = (ulong)bVar4;
      uVar12 = (uint)bVar4;
      if (*pbVar15 != bVar4) {
        bVar2 = (pnVar8->u).sparse.children[1];
        if (*pbVar15 != bVar2) {
          (pnVar8->u).dense.nbr = uVar3 - 1;
          return 1;
        }
        uVar6 = (uint)bVar2;
        iVar5 = uVar6 - uVar12;
        if (iVar5 != 0) {
          plVar14 = (long *)((long)pnVar8 + ((ulong)uVar6 * 8 - (ulong)((uint)bVar4 * 8)) + 0x18);
          do {
            if (*plVar14 != 0) {
              iVar5 = uVar6 - (int)uVar11;
              goto LAB_00102ec5;
            }
            uVar11 = uVar11 + 1;
            plVar14 = plVar14 + -1;
          } while (uVar6 != uVar11);
          iVar5 = 0;
        }
LAB_00102ec5:
        (pnVar8->u).sparse.children[1] = (char)iVar5 + bVar4;
        puVar1 = &((*self)->u).dense.nbr;
        *puVar1 = *puVar1 - 1;
        pnVar8 = *self;
        pnVar8 = (nn_trie_node *)
                 realloc(pnVar8,((ulong)(pnVar8->u).sparse.children[1] -
                                (ulong)(pnVar8->u).sparse.children[0]) * 8 + 0x20);
        *self = pnVar8;
        if (pnVar8 != (nn_trie_node *)0x0) {
          return 1;
        }
        __assert_fail("*self",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                      ,0x253,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      uVar6 = (uint)(pnVar8->u).sparse.children[1];
      uVar9 = uVar6 - uVar12;
      if (uVar9 == 0xffffffff) {
        uVar10 = 0;
      }
      else {
        uVar10 = uVar9 + 1;
        lVar13 = 0;
        do {
          if (*(long *)(pnVar8[1].prefix + lVar13 * 8 + -6) != 0) {
            uVar10 = (uint)lVar13;
            break;
          }
          lVar13 = lVar13 + 1;
        } while ((ulong)uVar9 + 1 != lVar13);
      }
      iVar5 = uVar12 + uVar10;
      memmove(pnVar8 + 1,pnVar8[1].prefix + (ulong)uVar10 * 8 + -6,
              (long)(int)((uVar6 - iVar5) + 1) << 3);
      ((*self)->u).sparse.children[0] = (uint8_t)iVar5;
      puVar1 = &((*self)->u).dense.nbr;
      *puVar1 = *puVar1 - 1;
      pnVar8 = (nn_trie_node *)
               realloc(*self,(long)(int)(((uint)((*self)->u).sparse.children[1] - iVar5) + 1) * 8 +
                             0x18);
      *self = pnVar8;
      if (pnVar8 != (nn_trie_node *)0x0) {
        return 1;
      }
      __assert_fail("*self",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                    ,0x244,
                    "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
    }
  }
  if (*self == (nn_trie_node *)0x0) {
    local_34 = -0x16;
  }
  else {
    nn_node_unsubscribe_cold_1();
    local_34 = (int)((ulong)in_RAX >> 0x20);
  }
  return local_34;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}